

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdatasrc.c
# Opt level: O0

void jpeg_mem_src(j_decompress_ptr cinfo,uchar *inbuffer,unsigned_long insize)

{
  jpeg_source_mgr *pjVar1;
  jpeg_source_mgr *src;
  unsigned_long insize_local;
  uchar *inbuffer_local;
  j_decompress_ptr cinfo_local;
  
  if ((inbuffer == (uchar *)0x0) || (insize == 0)) {
    cinfo->err->msg_code = 0x2b;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (cinfo->src == (jpeg_source_mgr *)0x0) {
    pjVar1 = (jpeg_source_mgr *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,0,0x38);
    cinfo->src = pjVar1;
  }
  pjVar1 = cinfo->src;
  pjVar1->init_source = init_mem_source;
  pjVar1->fill_input_buffer = fill_mem_input_buffer;
  pjVar1->skip_input_data = skip_input_data;
  pjVar1->resync_to_restart = jpeg_resync_to_restart;
  pjVar1->term_source = term_source;
  pjVar1->bytes_in_buffer = insize;
  pjVar1->next_input_byte = inbuffer;
  return;
}

Assistant:

GLOBAL(void)
jpeg_mem_src (j_decompress_ptr cinfo,
	      unsigned char * inbuffer, unsigned long insize)
{
  struct jpeg_source_mgr * src;

  if (inbuffer == NULL || insize == 0)	/* Treat empty input as fatal error */
    ERREXIT(cinfo, JERR_INPUT_EMPTY);

  /* The source object is made permanent so that a series of JPEG images
   * can be read from the same buffer by calling jpeg_mem_src only before
   * the first one.
   */
  if (cinfo->src == NULL) {	/* first time for this JPEG object? */
    cinfo->src = (struct jpeg_source_mgr *)
      (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_PERMANENT,
				  SIZEOF(struct jpeg_source_mgr));
  }

  src = cinfo->src;
  src->init_source = init_mem_source;
  src->fill_input_buffer = fill_mem_input_buffer;
  src->skip_input_data = skip_input_data;
  src->resync_to_restart = jpeg_resync_to_restart; /* use default method */
  src->term_source = term_source;
  src->bytes_in_buffer = (size_t) insize;
  src->next_input_byte = (JOCTET *) inbuffer;
}